

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManPrintCuts(Of_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Vec_Int_t *vFirst;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  int iVar5;
  uint nCutsAll;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint *puVar10;
  int iVar11;
  uint *puVar12;
  uint local_84;
  int *local_68;
  int *local_50;
  Vec_Int_t *local_48;
  
  pGVar4 = p->pGia;
  iVar5 = pGVar4->nObjs;
  lVar7 = (long)iVar5;
  vFirst = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar11 = iVar5;
  }
  vFirst->nCap = iVar11;
  if (iVar11 == 0) {
    vFirst->pArray = (int *)0x0;
    vFirst->nSize = iVar5;
    local_48 = (Vec_Int_t *)malloc(0x10);
    local_48->nCap = 0;
    local_50 = (int *)0x0;
    local_48->pArray = (int *)0x0;
    local_48->nSize = iVar5;
    local_68 = (int *)0x0;
  }
  else {
    local_50 = (int *)malloc((long)iVar11 << 2);
    vFirst->pArray = local_50;
    vFirst->nSize = iVar5;
    if (local_50 != (int *)0x0) {
      memset(local_50,0xff,lVar7 * 4);
    }
    local_48 = (Vec_Int_t *)malloc(0x10);
    local_48->nCap = iVar11;
    local_68 = (int *)malloc((long)iVar11 << 2);
    local_48->pArray = local_68;
    local_48->nSize = iVar5;
    if (local_68 == (int *)0x0) {
      local_68 = (int *)0x0;
    }
    else {
      memset(local_68,0xff,lVar7 * 4);
    }
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_01->pArray = piVar3;
  uVar9 = iVar5 + ~(pGVar4->vCos->nSize + pGVar4->vCis->nSize);
  Gia_ManFillValue(pGVar4);
  pGVar4 = p->pGia;
  if (pGVar4->nObjs < 1) {
    local_84 = 0;
    nCutsAll = 0;
  }
  else {
    lVar8 = 0;
    nCutsAll = 0;
    local_84 = 0;
    do {
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar4->pObjs + lVar8;
      uVar2 = *(uint *)pGVar1;
      if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
        if (p->pObjs[lVar8].nRefs == 0) {
          puVar12 = (uint *)0x0;
        }
        else {
          Vec_IntPush(p_00,local_84);
          if ((lVar8 == 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= lVar8)) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar2 = p->pObjs[lVar8].iCutH;
          uVar6 = (int)uVar2 >> 0x10;
          if (((int)uVar6 < 0) || ((p->vPages).nSize <= (int)uVar6)) goto LAB_0079b7b5;
          puVar12 = (uint *)((ulong)((uVar2 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar6]);
        }
        pGVar1->Value = local_84;
        if ((p->vCutSets).nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = (p->vCutSets).pArray[lVar8];
        uVar6 = (int)uVar2 >> 0x10;
        if (((int)uVar6 < 0) || ((p->vPages).nSize <= (int)uVar6)) {
LAB_0079b7b5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (lVar7 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        local_84 = local_84 + 1;
        piVar3 = (int *)((ulong)((uVar2 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar6]);
        iVar5 = *piVar3;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        local_50[lVar8] = uVar9 + nCutsAll;
        local_68[lVar8] = iVar5;
        iVar5 = *piVar3;
        if (0 < iVar5) {
          puVar10 = (uint *)(piVar3 + 1);
          iVar11 = 0;
          do {
            if (puVar12 == puVar10) {
              Vec_IntPush(p_01,iVar11 + uVar9 + nCutsAll);
              iVar5 = *piVar3;
            }
            iVar11 = iVar11 + 1;
            puVar10 = puVar10 + (ulong)(*puVar10 & 0x1f) + 4;
          } while (iVar11 < iVar5);
          pGVar4 = p->pGia;
          nCutsAll = nCutsAll + iVar11;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pGVar4->nObjs);
  }
  if (local_84 != uVar9) {
    __assert_fail("nAndsAll == Shift",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x68b,"void Of_ManPrintCuts(Of_Man_t *)");
  }
  printf("Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n",(ulong)uVar9,(ulong)(uint)p_00->nSize,
         (ulong)nCutsAll);
  Of_ManCreateSat(p,nCutsAll,vFirst,local_48,p_00,p_01);
  if (local_50 != (int *)0x0) {
    free(local_50);
  }
  free(vFirst);
  if (local_68 != (int *)0x0) {
    free(local_68);
  }
  free(local_48);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  return;
}

Assistant:

void Of_ManPrintCuts( Of_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    int * pCutSet, * pCut, * pCutBest;
    int i, k, v, Var, nCuts;
    Vec_Int_t * vFirst  = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCutNum = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vBestNode = Vec_IntAlloc( 100 );
    Vec_Int_t * vBestCut  = Vec_IntAlloc( 100 );
    int nAndsAll = 0, nCutsAll = 0, Shift = Gia_ManAndNum(p->pGia);
    Gia_ManFillValue( p->pGia );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        // get the best cut
        pCutBest = NULL;
        if ( Of_ObjRefNum(p, i) )
        {
            Vec_IntPush( vBestNode, nAndsAll );
            pCutBest = Of_ObjCutBestP( p, i ); 
        }
        pObj->Value = nAndsAll++;
        // get the cutset
        pCutSet = Of_ObjCutSet(p, i);
        // count cuts
        nCuts = 0;
        Of_SetForEachCut( pCutSet, pCut, k )
            nCuts++;
        // save
        Vec_IntWriteEntry( vFirst,  i, Shift + nCutsAll );
        Vec_IntWriteEntry( vCutNum, i, nCuts );
        // print cuts
        if ( fVerbose )
            printf( "Node %d. Cuts %d.\n", i, nCuts );
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            if ( fVerbose )
            {
                printf( "{ " );
                Of_CutForEachVar( pCut, Var, v )
                    printf( "%d ", Var );
                printf( "} %s\n", pCutBest == pCut ? "best" :"" );
            }
            if ( pCutBest == pCut )
                Vec_IntPush( vBestCut, Shift + nCutsAll );
            nCutsAll++;
        }
    }
    assert( nAndsAll == Shift );
    printf( "Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n", nAndsAll, Vec_IntSize(vBestNode), nCutsAll );

    // create SAT problem
    Of_ManCreateSat( p, nCutsAll, vFirst, vCutNum, vBestNode, vBestCut );

    Vec_IntFree( vFirst );
    Vec_IntFree( vCutNum );
    Vec_IntFree( vBestNode );
    Vec_IntFree( vBestCut );
}